

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::BackgroundCompaction(DBImpl *this)

{
  int iVar1;
  ManualCompaction *pMVar2;
  Logger *pLVar3;
  InternalKey *this_00;
  pointer ppFVar4;
  FileMetaData *pFVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  InternalKey *this_01;
  Status SVar8;
  bool bVar9;
  Compaction *this_02;
  char *pcVar10;
  CompactionState *compact;
  _Alloc_hider _Var11;
  VersionEdit *this_03;
  _Alloc_hider _Var12;
  Status status;
  string local_118;
  undefined1 local_f8 [32];
  InternalKey manual_end;
  string local_b8;
  LevelSummaryStorage tmp;
  
  if (this->imm_ != (MemTable *)0x0) {
    CompactMemTable(this);
    return;
  }
  pMVar2 = this->manual_compaction_;
  manual_end.rep_._M_dataplus._M_p = (pointer)&manual_end.rep_.field_2;
  manual_end.rep_._M_string_length = 0;
  manual_end.rep_.field_2._M_local_buf[0] = '\0';
  if (pMVar2 == (ManualCompaction *)0x0) {
    this_02 = VersionSet::PickCompaction(this->versions_);
    status.state_ = (char *)0x0;
    if (this_02 == (Compaction *)0x0) goto LAB_0010c8a4;
    bVar9 = Compaction::IsTrivialMove(this_02);
    if (!bVar9) goto LAB_0010c81e;
    ppFVar4 = this_02->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (((long)this_02->inputs_[0].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 & 0x7fffffff8U) != 8) {
      __assert_fail("c->num_input_files(0) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                    ,0x2cf,"void leveldb::DBImpl::BackgroundCompaction()");
    }
    pFVar5 = *ppFVar4;
    this_03 = &this_02->edit_;
    VersionEdit::DeleteFile(this_03,this_02->level_,pFVar5->number);
    VersionEdit::AddFile
              (this_03,this_02->level_ + 1,pFVar5->number,pFVar5->file_size,&pFVar5->smallest,
               &pFVar5->largest);
    VersionSet::LogAndApply((VersionSet *)&tmp,(VersionEdit *)this->versions_,(Mutex *)this_03);
    SVar8 = status;
    status.state_ = (char *)tmp.buffer._0_8_;
    tmp.buffer._0_8_ = SVar8.state_;
    Status::~Status((Status *)&tmp);
    if (status.state_ != (char *)0x0) {
      RecordBackgroundError(this,&status);
    }
    pLVar3 = (this->options_).info_log;
    uVar6 = pFVar5->number;
    uVar7 = pFVar5->file_size;
    iVar1 = this_02->level_;
    Status::ToString_abi_cxx11_(&local_118,&status);
    pcVar10 = VersionSet::LevelSummary(this->versions_,&tmp);
    Log(pLVar3,"Moved #%lld to level-%d %lld bytes %s: %s\n",uVar6,(ulong)(iVar1 + 1),uVar7,
        local_118._M_dataplus._M_p,pcVar10);
    std::__cxx11::string::~string((string *)&local_118);
  }
  else {
    this_02 = VersionSet::CompactRange(this->versions_,pMVar2->level,pMVar2->begin,pMVar2->end);
    pMVar2->done = this_02 == (Compaction *)0x0;
    if (this_02 != (Compaction *)0x0) {
      std::__cxx11::string::_M_assign((string *)&manual_end);
    }
    pLVar3 = (this->options_).info_log;
    iVar1 = pMVar2->level;
    this_00 = pMVar2->begin;
    if (this_00 == (InternalKey *)0x0) {
      pcVar10 = "(begin)";
    }
    else {
      InternalKey::DebugString_abi_cxx11_((string *)&tmp,this_00);
      pcVar10 = (char *)tmp.buffer._0_8_;
    }
    this_01 = pMVar2->end;
    _Var11._M_p = "(end)";
    if (this_01 != (InternalKey *)0x0) {
      InternalKey::DebugString_abi_cxx11_(&local_118,this_01);
      _Var11._M_p = local_118._M_dataplus._M_p;
    }
    bVar9 = pMVar2->done;
    _Var12._M_p = "(end)";
    if (bVar9 == false) {
      InternalKey::DebugString_abi_cxx11_(&local_b8,&manual_end);
      _Var12._M_p = local_b8._M_dataplus._M_p;
    }
    Log(pLVar3,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",iVar1,pcVar10,
        _Var11._M_p,_Var12._M_p);
    if (bVar9 == false) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if (this_01 != (InternalKey *)0x0) {
      std::__cxx11::string::~string((string *)&local_118);
    }
    if (this_00 != (InternalKey *)0x0) {
      std::__cxx11::string::~string((string *)&tmp);
    }
    status.state_ = (char *)0x0;
    if (this_02 == (Compaction *)0x0) {
LAB_0010c8a4:
      status.state_ = (char *)0x0;
      this_02 = (Compaction *)0x0;
      goto LAB_0010c8a7;
    }
LAB_0010c81e:
    compact = (CompactionState *)operator_new(0x40);
    compact->compaction = this_02;
    compact->smallest_snapshot = 0;
    (compact->outputs).
    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (compact->outputs).
    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (compact->outputs).
    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    compact->outfile = (WritableFile *)0x0;
    compact->builder = (TableBuilder *)0x0;
    compact->total_bytes = 0;
    DoCompactionWork((DBImpl *)local_f8,(CompactionState *)this);
    SVar8 = status;
    status.state_ = (char *)local_f8._0_8_;
    local_f8._0_8_ = SVar8.state_;
    Status::~Status((Status *)local_f8);
    if (status.state_ != (char *)0x0) {
      RecordBackgroundError(this,&status);
    }
    CleanupCompaction(this,compact);
    Compaction::ReleaseInputs(this_02);
    DeleteObsoleteFiles(this);
  }
  Compaction::~Compaction(this_02);
LAB_0010c8a7:
  operator_delete(this_02);
  if ((status.state_ != (char *)0x0) && (((this->shutting_down_)._M_base._M_i & 1U) == 0)) {
    pLVar3 = (this->options_).info_log;
    Status::ToString_abi_cxx11_((string *)local_f8,&status);
    Log(pLVar3,"Compaction error: %s",local_f8._0_8_);
    std::__cxx11::string::~string((string *)local_f8);
  }
  if (pMVar2 != (ManualCompaction *)0x0) {
    pMVar2 = this->manual_compaction_;
    if (status.state_ == (char *)0x0) {
      if ((pMVar2->done & 1U) == 0) {
        std::__cxx11::string::_M_assign((string *)&pMVar2->tmp_storage);
        pMVar2->begin = &pMVar2->tmp_storage;
      }
    }
    else {
      pMVar2->done = true;
    }
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  Status::~Status(&status);
  std::__cxx11::string::~string((string *)&manual_end);
  return;
}

Assistant:

void DBImpl::BackgroundCompaction() {
  mutex_.AssertHeld();

  if (imm_ != nullptr) {
    CompactMemTable();
    return;
  }

  Compaction* c;
  bool is_manual = (manual_compaction_ != nullptr);
  InternalKey manual_end;
  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    c = versions_->CompactRange(m->level, m->begin, m->end);
    m->done = (c == nullptr);
    if (c != nullptr) {
      manual_end = c->input(0, c->num_input_files(0) - 1)->largest;
    }
    Log(options_.info_log,
        "Manual compaction at level-%d from %s .. %s; will stop at %s\n",
        m->level, (m->begin ? m->begin->DebugString().c_str() : "(begin)"),
        (m->end ? m->end->DebugString().c_str() : "(end)"),
        (m->done ? "(end)" : manual_end.DebugString().c_str()));
  } else {
    c = versions_->PickCompaction();
  }

  Status status;
  if (c == nullptr) {
    // Nothing to do
  } else if (!is_manual && c->IsTrivialMove()) {
    // Move file to next level
    assert(c->num_input_files(0) == 1);
    FileMetaData* f = c->input(0, 0);
    c->edit()->DeleteFile(c->level(), f->number);
    c->edit()->AddFile(c->level() + 1, f->number, f->file_size, f->smallest,
                       f->largest);
    status = versions_->LogAndApply(c->edit(), &mutex_);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    VersionSet::LevelSummaryStorage tmp;
    Log(options_.info_log, "Moved #%lld to level-%d %lld bytes %s: %s\n",
        static_cast<unsigned long long>(f->number), c->level() + 1,
        static_cast<unsigned long long>(f->file_size),
        status.ToString().c_str(), versions_->LevelSummary(&tmp));
  } else {
    CompactionState* compact = new CompactionState(c);
    status = DoCompactionWork(compact);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    CleanupCompaction(compact);
    c->ReleaseInputs();
    DeleteObsoleteFiles();
  }
  delete c;

  if (status.ok()) {
    // Done
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // Ignore compaction errors found during shutting down
  } else {
    Log(options_.info_log, "Compaction error: %s", status.ToString().c_str());
  }

  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    if (!status.ok()) {
      m->done = true;
    }
    if (!m->done) {
      // We only compacted part of the requested range.  Update *m
      // to the range that is left to be compacted.
      m->tmp_storage = manual_end;
      m->begin = &m->tmp_storage;
    }
    manual_compaction_ = nullptr;
  }
}